

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall tf::TFProfManager::~TFProfManager(TFProfManager *this)

{
  undefined1 uVar1;
  long lVar2;
  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  *pvVar3;
  size_type sVar4;
  undefined8 uVar5;
  string *in_RDI;
  size_t i_2;
  ostringstream oss;
  size_t i_1;
  Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> serializer;
  size_t i;
  ProfileData data;
  ofstream ofs;
  value_type *in_stack_fffffffffffffbe8;
  FILE *__stream;
  vector<tf::Timeline,_std::allocator<tf::Timeline>_> *in_stack_fffffffffffffbf0;
  ulong uVar6;
  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc18;
  string local_3d8 [32];
  ulong local_3b8;
  ostringstream local_3b0 [40];
  ostream *in_stack_fffffffffffffc78;
  TFProfObserver *in_stack_fffffffffffffc80;
  ulong local_238;
  Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> local_230;
  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  *local_228;
  long local_208 [48];
  ostream *in_stack_ffffffffffffff78;
  TFProfObserver *in_stack_ffffffffffffff80;
  
  std::ofstream::ofstream(local_208,in_RDI,0x10);
  uVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_208 + *(long *)(local_208[0] + -0x18)));
  if ((bool)uVar1) {
    lVar2 = std::__cxx11::string::rfind((char *)in_RDI,0x1385a4);
    if (lVar2 == -1) {
      std::operator<<((ostream *)local_208,"[\n");
      for (local_238 = 0;
          sVar4 = std::
                  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                  ::size((vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                          *)(in_RDI + 0x48)), local_238 < sVar4; local_238 = local_238 + 1) {
        if (local_238 != 0) {
          std::operator<<((ostream *)local_208,',');
        }
        std::
        vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
        ::operator[]((vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                      *)(in_RDI + 0x48),local_238);
        std::__shared_ptr_access<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x11e722);
        TFProfObserver::dump(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      }
      std::operator<<((ostream *)local_208,"]\n");
    }
    else {
      ProfileData::ProfileData((ProfileData *)0x11e5bc);
      std::
      vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
      ::size((vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
              *)(in_RDI + 0x48));
      std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>::reserve
                ((vector<tf::Timeline,_std::allocator<tf::Timeline>_> *)in_RDI,
                 CONCAT17(uVar1,in_stack_fffffffffffffc18));
      local_228 = (vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                   *)0x0;
      while (in_stack_fffffffffffffc00 = local_228,
            pvVar3 = (vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                      *)std::
                        vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                        ::size((vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                                *)(in_RDI + 0x48)), in_stack_fffffffffffffc00 < pvVar3) {
        std::
        vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
        ::operator[]((vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                      *)(in_RDI + 0x48),(size_type)local_228);
        std::__shared_ptr_access<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x11e62b);
        std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>::push_back
                  (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
        local_228 = (vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                     *)((long)&(local_228->
                               super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1);
      }
      Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::Serializer
                (&local_230,(basic_ofstream<char,_std::char_traits<char>_> *)local_208);
      Serializer<std::ofstream,long>::operator()
                ((Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> *)
                 in_stack_fffffffffffffbf0,(ProfileData *)in_stack_fffffffffffffbe8);
      ProfileData::~ProfileData((ProfileData *)0x11e694);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_3b0);
    local_3b8 = 0;
    while (uVar6 = local_3b8,
          sVar4 = std::
                  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                  ::size((vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                          *)(in_RDI + 0x48)), uVar6 < sVar4) {
      std::
      vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
      ::operator[]((vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                    *)(in_RDI + 0x48),local_3b8);
      std::__shared_ptr_access<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x11e7c1);
      TFProfObserver::summary(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_3b8 = local_3b8 + 1;
    }
    __stream = _stderr;
    std::__cxx11::ostringstream::str();
    uVar5 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s",uVar5);
    std::__cxx11::string::~string(local_3d8);
    std::__cxx11::ostringstream::~ostringstream(local_3b0);
  }
  std::ofstream::~ofstream(local_208);
  std::
  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  ::~vector(in_stack_fffffffffffffc00);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

inline TFProfManager::~TFProfManager() {
  std::ofstream ofs(_fpath);
  if(ofs) {
    // .tfp
    if(_fpath.rfind(".tfp") != std::string::npos) {
      ProfileData data;
      data.timelines.reserve(_observers.size());
      for(size_t i=0; i<_observers.size(); ++i) {
        data.timelines.push_back(std::move(_observers[i]->_timeline));
      }
      Serializer<std::ofstream> serializer(ofs); 
      serializer(data);
    }
    // .json
    else { // if(_fpath.rfind(".json") != std::string::npos) {
      ofs << "[\n";
      for(size_t i=0; i<_observers.size(); ++i) {
        if(i) ofs << ',';
        _observers[i]->dump(ofs);
      }
      ofs << "]\n";
    }
  }
  // do a summary report in stderr for each observer
  else {
    std::ostringstream oss;
    for(size_t i=0; i<_observers.size(); ++i) {
      _observers[i]->summary(oss);
    }
    fprintf(stderr, "%s", oss.str().c_str());
  }
}